

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXCompilerLibrary.cpp
# Opt level: O3

void __thiscall Diligent::DXCompilerLibrary::DetectMaxShaderModel(DXCompilerLibrary *this)

{
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  HRESULT HVar2;
  int iVar3;
  DxcCreateInstanceProc p_Var4;
  char (*in_RCX) [31];
  long lVar5;
  char *pcVar6;
  string *psVar7;
  pointer ppwVar8;
  uint uVar9;
  uint uVar10;
  byte bVar11;
  HRESULT status;
  CComPtr<IDxcBlobEncoding> pSourceBlob;
  CComPtr<IDxcCompiler> pdxcCompiler;
  CComPtr<IDxcLibrary> pdxcLibrary;
  CComPtr<IDxcOperationResult> pdxcResult;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_c8;
  wstring Profile;
  vector<const_wchar_t_*,_std::allocator<const_wchar_t_*>_> DxilArgs;
  string msg;
  
  bVar11 = 0;
  p_Var4 = this->m_DxcCreateInstance;
  if (p_Var4 == (DxcCreateInstanceProc)0x0) {
    FormatString<char[26],char[31]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_DxcCreateInstance != nullptr",in_RCX);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x4d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    p_Var4 = this->m_DxcCreateInstance;
  }
  pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p = (CComPtrBase<IDxcLibrary>)(IDxcLibrary *)0x0;
  HVar2 = (*p_Var4)(&CLSID_DxcLibrary,(REFIID)_GUID_e5204dc7_d18c_4c3c_bdfb_851673980fe7,
                    (LPVOID *)&pdxcLibrary);
  if (HVar2 < 0) {
    LogError<true,char[29]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x51,(char (*) [29])"Failed to create DXC Library");
  }
  pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p = (CComPtrBase<IDxcCompiler>)(IDxcCompiler *)0x0;
  HVar2 = (*this->m_DxcCreateInstance)
                    (&CLSID_DxcCompiler,(REFIID)_GUID_8c210bf3_011f_4422_8d70_6f9acb8db617,
                     (LPVOID *)&pdxcCompiler);
  if (HVar2 < 0) {
    LogError<true,char[30]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x54,(char (*) [30])"Failed to create DXC Compiler");
  }
  pcVar6 = "\nfloat4 main() : SV_Target0\n{\n    return float4(0.0, 0.0, 0.0, 0.0);\n}\n";
  psVar7 = &msg;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    (psVar7->_M_dataplus)._M_p = *(pointer *)pcVar6;
    pcVar6 = pcVar6 + ((ulong)bVar11 * -2 + 1) * 8;
    psVar7 = (string *)((long)psVar7 + (ulong)bVar11 * -0x10 + 8);
  }
  pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p =
       (CComPtrBase<IDxcBlobEncoding>)(IDxcBlobEncoding *)0x0;
  iVar3 = (**(code **)(*(long *)pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p + 0x30))
                    (pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p,&msg,0x48,0xfde9);
  if (iVar3 < 0) {
    LogError<true,char[35]>
              (false,"DetectMaxShaderModel",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/DXCompilerLibrary.cpp"
               ,0x5e,(char (*) [35])"Failed to create DXC Blob Encoding");
  }
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (this->m_Target == Vulkan) {
    Profile._M_dataplus._M_p = L"-spirv";
    std::vector<wchar_t_const*,std::allocator<wchar_t_const*>>::emplace_back<wchar_t_const*>
              ((vector<wchar_t_const*,std::allocator<wchar_t_const*>> *)&DxilArgs,
               (wchar_t **)&Profile);
  }
  paVar1 = &Profile.field_2;
  uVar10 = 0;
  while( true ) {
    Profile._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&Profile,L"ps_6_",L"");
    uVar9 = uVar10 + 1;
    __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
              ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
               &pdxcResult,vswprintf,0x10,L"%u",(ulong)uVar9);
    std::__cxx11::wstring::_M_append
              ((wchar_t *)&Profile,(ulong)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p);
    if (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p != (IDxcOperationResult *)&local_c8) {
      operator_delete((void *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p,
                      local_c8._M_allocated_capacity * 4 + 4);
    }
    pdxcResult.super_CComPtrBase<IDxcOperationResult>.p =
         (CComPtrBase<IDxcOperationResult>)(IDxcOperationResult *)0x0;
    ppwVar8 = DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((long)DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl
              .super__Vector_impl_data._M_start == 0) {
      ppwVar8 = (pointer)0x0;
    }
    iVar3 = (**(code **)(*(long *)pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p + 0x18))
                      (pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p,
                       pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p,L"",L"main",
                       Profile._M_dataplus._M_p,ppwVar8,
                       (ulong)((long)DxilArgs.
                                     super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)DxilArgs.
                                    super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3,0,0,0,
                       (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *
                       )&pdxcResult);
    if (iVar3 < 0) break;
    status = -0x7fffbffb;
    iVar3 = (**(code **)(*(long *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p + 0x18))
                      (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p,&status);
    if ((iVar3 < 0) || (status < 0)) {
      if (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p != (IDxcOperationResult *)0x0) {
        (**(code **)(*(long *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p + 0x10))();
      }
LAB_002a4f5a:
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)Profile._M_dataplus._M_p != paVar1) {
        operator_delete(Profile._M_dataplus._M_p,Profile.field_2._M_allocated_capacity * 4 + 4);
      }
      this->m_MaxShaderModel = (ShaderVersion)((ulong)uVar10 << 0x20 | 6);
      if (DxilArgs.super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(DxilArgs.
                        super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)DxilArgs.
                              super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)DxilArgs.
                              super__Vector_base<const_wchar_t_*,_std::allocator<const_wchar_t_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p != (IDxcBlobEncoding *)0x0) {
        (**(code **)(*(long *)pSourceBlob.super_CComPtrBase<IDxcBlobEncoding>.p + 0x10))();
      }
      if (pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p != (IDxcCompiler *)0x0) {
        (**(code **)(*(long *)pdxcCompiler.super_CComPtrBase<IDxcCompiler>.p + 0x10))();
      }
      if (pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p != (IDxcLibrary *)0x0) {
        (**(code **)(*(long *)pdxcLibrary.super_CComPtrBase<IDxcLibrary>.p + 0x10))();
      }
      return;
    }
    if (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p != (IDxcOperationResult *)0x0) {
      (**(code **)(*(long *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p + 0x10))();
    }
    uVar10 = uVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)Profile._M_dataplus._M_p != paVar1) {
      operator_delete(Profile._M_dataplus._M_p,Profile.field_2._M_allocated_capacity * 4 + 4);
    }
  }
  if (pdxcResult.super_CComPtrBase<IDxcOperationResult>.p != (IDxcOperationResult *)0x0) {
    (**(code **)(*(long *)pdxcResult.super_CComPtrBase<IDxcOperationResult>.p + 0x10))();
  }
  goto LAB_002a4f5a;
}

Assistant:

void DXCompilerLibrary::DetectMaxShaderModel()
{
    VERIFY_EXPR(m_DxcCreateInstance != nullptr);
    try
    {
        CComPtr<IDxcLibrary> pdxcLibrary;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcLibrary, IID_PPV_ARGS(&pdxcLibrary)), "Failed to create DXC Library");

        CComPtr<IDxcCompiler> pdxcCompiler;
        CHECK_D3D_RESULT(m_DxcCreateInstance(CLSID_DxcCompiler, IID_PPV_ARGS(&pdxcCompiler)), "Failed to create DXC Compiler");

        constexpr char TestShader[] = R"(
float4 main() : SV_Target0
{
    return float4(0.0, 0.0, 0.0, 0.0);
}
)";

        CComPtr<IDxcBlobEncoding> pSourceBlob;
        CHECK_D3D_RESULT(pdxcLibrary->CreateBlobWithEncodingFromPinned(TestShader, sizeof(TestShader), CP_UTF8, &pSourceBlob), "Failed to create DXC Blob Encoding");

        ShaderVersion MaxSM{6, 0};

        std::vector<const wchar_t*> DxilArgs;
        if (m_Target == DXCompilerTarget::Vulkan)
            DxilArgs.push_back(L"-spirv");

        for (Uint32 MinorVer = 1;; ++MinorVer)
        {
            std::wstring Profile = L"ps_6_";
            Profile += std::to_wstring(MinorVer);

            CComPtr<IDxcOperationResult> pdxcResult;

            auto hr = pdxcCompiler->Compile(
                pSourceBlob,
                L"",
                L"main",
                Profile.c_str(),
                !DxilArgs.empty() ? DxilArgs.data() : nullptr,
                static_cast<UINT32>(DxilArgs.size()),
                nullptr, // Array of defines
                0,       // Number of defines
                nullptr, // Include handler
                &pdxcResult);
            if (FAILED(hr))
                break;

            HRESULT status = E_FAIL;
            if (FAILED(pdxcResult->GetStatus(&status)))
                break;
            if (FAILED(status))
                break;

            MaxSM.Minor = MinorVer;
        }

        m_MaxShaderModel = MaxSM;
    }
    catch (...)
    {
        LOG_ERROR_MESSAGE("Failed to detect max shader model for DXC compiler");
    }
}